

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_defined_units.cpp
# Opt level: O0

void __thiscall
unitStringDefinitions_measurementVectorLength_Test::
~unitStringDefinitions_measurementVectorLength_Test
          (unitStringDefinitions_measurementVectorLength_Test *this)

{
  unitStringDefinitions_measurementVectorLength_Test *this_local;
  
  ~unitStringDefinitions_measurementVectorLength_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitStringDefinitions, measurementVectorLength)
{
    for (std::size_t ii = 0; ii < units::defined_measurement_types.size();
         ++ii) {
        EXPECT_TRUE(units::defined_measurement_types[ii].first != nullptr)
            << ii;
        if (units::defined_measurement_types[ii].first == nullptr) {
            break;
        }
    }
}